

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<anurbs::BrepTrim,_std::shared_ptr<anurbs::BrepTrim>_>::dealloc
               (value_and_holder *v_h)

{
  bool bVar1;
  shared_ptr<anurbs::BrepTrim> *this;
  BrepTrim **ppBVar2;
  void **ppvVar3;
  value_and_holder *v_h_local;
  
  bVar1 = detail::value_and_holder::holder_constructed(v_h);
  if (bVar1) {
    this = detail::value_and_holder::holder<std::shared_ptr<anurbs::BrepTrim>>(v_h);
    std::shared_ptr<anurbs::BrepTrim>::~shared_ptr(this);
    detail::value_and_holder::set_holder_constructed(v_h,false);
  }
  else {
    ppBVar2 = detail::value_and_holder::value_ptr<anurbs::BrepTrim>(v_h);
    detail::call_operator_delete(*ppBVar2,v_h->type->type_size,v_h->type->type_align);
  }
  ppvVar3 = detail::value_and_holder::value_ptr<void>(v_h);
  *ppvVar3 = (void *)0x0;
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }